

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_add_passphrase.c
# Opt level: O0

archive_read_passphrase * new_read_passphrase(archive_read *a,char *passphrase)

{
  long lVar1;
  char *pcVar2;
  archive_read_passphrase *p;
  char *passphrase_local;
  archive_read *a_local;
  
  a_local = (archive_read *)malloc(0x10);
  if (a_local == (archive_read *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    a_local = (archive_read *)0x0;
  }
  else {
    pcVar2 = strdup(passphrase);
    *(char **)&a_local->archive = pcVar2;
    lVar1._0_4_ = (a_local->archive).magic;
    lVar1._4_4_ = (a_local->archive).state;
    if (lVar1 == 0) {
      free(a_local);
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      a_local = (archive_read *)0x0;
    }
  }
  return (archive_read_passphrase *)a_local;
}

Assistant:

static struct archive_read_passphrase *
new_read_passphrase(struct archive_read *a, const char *passphrase)
{
	struct archive_read_passphrase *p;

	p = malloc(sizeof(*p));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (NULL);
	}
	p->passphrase = strdup(passphrase);
	if (p->passphrase == NULL) {
		free(p);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (NULL);
	}
	return (p);
}